

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

void __thiscall
Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::expand
          (Set<Kernel::Literal_*,_Lib::DefaultHash> *this)

{
  Cell *__ptr;
  int iVar1;
  void *placement;
  Cell *pCVar2;
  uint uVar3;
  size_t length;
  Cell *pCVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  iVar1 = 0x1f;
  if (this->_capacity != 0) {
    iVar1 = this->_capacity * 2;
  }
  length = (size_t)iVar1;
  __ptr = this->_entries;
  placement = Lib::alloc(length * 0x10);
  pCVar2 = array_new<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::Cell>(placement,length);
  this->_entries = pCVar2;
  auVar6._8_4_ = iVar1 >> 0x1f;
  auVar6._0_8_ = length;
  auVar6._12_4_ = 0x45300000;
  this->_afterLast = pCVar2 + length;
  this->_maxEntries =
       (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 0.8);
  this->_capacity = iVar1;
  uVar3 = this->_size;
  this->_nonemptyCells = 0;
  this->_size = 0;
  pCVar2 = __ptr;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    do {
      pCVar4 = pCVar2;
      pCVar2 = pCVar4 + 1;
    } while (pCVar4->code < 2);
    insert(this,pCVar4->value,pCVar4->code);
  }
  if (__ptr != (Cell *)0x0) {
    Lib::free(__ptr);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    size_t newCapacity = _capacity ? _capacity * 2 : 31;
    Cell* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Cell),"Set::Cell");

    _entries = array_new<Cell>(mem, newCapacity);
    _afterLast = _entries + newCapacity;
    _maxEntries = (int)(newCapacity * 0.8);
    size_t oldCapacity = _capacity;
    _capacity = newCapacity;

    // experiments using (a) random numbers (b) consecutive numbers
    // and 30,000,000 allocations
    // 0.6 :  8.49 7.55
    // 0.7 :  9.19 7.71
    // 0.8 :  9.10 8.44
    // 0.9 :  9.34 7.36 (fewer allocations (21 vs. 22), fewer cache faults)
    // 0.95: 10.21 7.48
    // copy old entries
    Cell* current = oldEntries;
    int remaining = _size;
    _nonemptyCells = 0;
    _size = 0;
    while (remaining != 0) {
      // find first occupied cell
      while (! current->occupied()) {
	current++;
      }
      // now current is occupied
      insert(current->value,current->code);
      current ++;
      remaining --;
    }

    if (oldEntries) {
      array_delete(oldEntries,oldCapacity);
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Cell),"Set::Cell");
    }
  }